

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall FIX::Session::generateSequenceReset(Session *this,SEQNUM beginSeqNo,SEQNUM endSeqNo)

{
  _func_int **pp_Var1;
  Header *this_00;
  FieldBase *this_01;
  IntTConvertor<unsigned_long> *this_02;
  long *plVar2;
  _func_int **pp_Var3;
  unsigned_long value;
  NewSeqNo newSeqNo;
  Message sequenceReset;
  undefined1 local_248 [88];
  string local_1f0;
  undefined1 local_1d0 [16];
  _Alloc_hider local_1c0;
  char local_1b0 [16];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  field_metrics local_180;
  Message local_178;
  
  pp_Var1 = (_func_int **)(local_248 + 0x10);
  local_248._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,&MsgType_SequenceReset,0x1d0a85);
  local_1d0._0_8_ = &PTR__FieldBase_001f8470;
  local_1d0._8_4_ = 0x23;
  local_1c0._M_p = local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_248._0_8_,(pointer)(local_248._0_8_ + local_248._8_8_));
  local_1a0._M_p = (pointer)&local_190;
  local_198 = 0;
  local_190._M_local_buf[0] = '\0';
  local_180.m_length = 0;
  local_180.m_checksum = 0;
  local_1d0._0_8_ = &PTR__FieldBase_001f9500;
  newMessage(&local_178,this,(MsgType *)local_1d0);
  FieldBase::~FieldBase((FieldBase *)local_1d0);
  if ((_func_int **)local_248._0_8_ != pp_Var1) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  UInt64Field::UInt64Field((UInt64Field *)local_1d0,0x24,endSeqNo);
  local_1d0._0_8_ = &PTR__FieldBase_001f9f10;
  BoolField::BoolField((BoolField *)local_248,0x2b,true);
  this_00 = &local_178.m_header;
  local_248._0_8_ = &PTR__FieldBase_001f9fb8;
  FieldMap::setField(&this_00->super_FieldMap,(FieldBase *)local_248,true);
  FieldBase::~FieldBase((FieldBase *)local_248);
  FieldMap::setField(&local_178.super_FieldMap,(FieldBase *)local_1d0,true);
  fill(this,this_00);
  this_01 = FieldMap::getFieldRef(&this_00->super_FieldMap,0x34);
  UtcTimeStampField::getValue((UtcTimeStamp *)local_248,(UtcTimeStampField *)this_01);
  insertOrigSendingTime(this,this_00,(UtcTimeStamp *)local_248);
  UInt64Field::UInt64Field((UInt64Field *)local_248,0x22,beginSeqNo);
  local_248._0_8_ = &PTR__FieldBase_001f9d88;
  FieldMap::setField(&this_00->super_FieldMap,(FieldBase *)local_248,true);
  FieldBase::~FieldBase((FieldBase *)local_248);
  BoolField::BoolField((BoolField *)local_248,0x7b,true);
  local_248._0_8_ = &PTR__FieldBase_001f9ed8;
  FieldMap::setField(&local_178.super_FieldMap,(FieldBase *)local_248,true);
  FieldBase::~FieldBase((FieldBase *)local_248);
  sendRaw(this,&local_178,beginSeqNo);
  this_02 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)local_1d0);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_1f0,this_02,value);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,0x1d10a5);
  pp_Var3 = (_func_int **)(plVar2 + 2);
  if ((_func_int **)*plVar2 == pp_Var3) {
    local_248._16_8_ = *pp_Var3;
    local_248._24_8_ = plVar2[3];
    local_248._0_8_ = pp_Var1;
  }
  else {
    local_248._16_8_ = *pp_Var3;
    local_248._0_8_ = (_func_int **)*plVar2;
  }
  local_248._8_8_ = plVar2[1];
  *plVar2 = (long)pp_Var3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  SessionState::onEvent(&this->m_state,(string *)local_248);
  if ((_func_int **)local_248._0_8_ != pp_Var1) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  FieldBase::~FieldBase((FieldBase *)local_1d0);
  Message::~Message(&local_178);
  return;
}

Assistant:

void Session::generateSequenceReset(SEQNUM beginSeqNo, SEQNUM endSeqNo) {
  Message sequenceReset = newMessage(MsgType(MsgType_SequenceReset));

  NewSeqNo newSeqNo(endSeqNo);
  sequenceReset.getHeader().setField(PossDupFlag(true));
  sequenceReset.setField(newSeqNo);
  fill(sequenceReset.getHeader());

  insertOrigSendingTime(sequenceReset.getHeader(), sequenceReset.getHeader().getField<SendingTime>());
  sequenceReset.getHeader().setField(MsgSeqNum(beginSeqNo));
  sequenceReset.setField(GapFillFlag(true));
  sendRaw(sequenceReset, beginSeqNo);
  m_state.onEvent("Sent SequenceReset TO: " + SEQNUM_CONVERTOR::convert(newSeqNo));
}